

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileSystem.cpp
# Opt level: O1

int __thiscall
anon_unknown.dwarf_5175ef::LocalFileSystem::remove(LocalFileSystem *this,char *__filename)

{
  anon_unknown_dwarf_5175ef *this_00;
  int iVar1;
  int *piVar2;
  char *pcVar3;
  uint32_t *in_R8;
  error_code eVar4;
  StringRef path;
  StatStruct statbuf;
  undefined4 local_9c;
  stat local_98;
  
  iVar1 = llbuild::basic::sys::unlink(*(char **)__filename);
  if (iVar1 != 0) {
    piVar2 = __errno_location();
    if ((((*piVar2 != 0x15) && (*piVar2 != 1)) ||
        (iVar1 = llbuild::basic::sys::lstat(*(char **)__filename,&local_98), iVar1 != 0)) ||
       ((local_98.st_mode & 0xf000) != 0x4000)) {
      return 0;
    }
    iVar1 = llbuild::basic::sys::rmdir(*(char **)__filename);
    if (iVar1 != 0) {
      this_00 = *(anon_unknown_dwarf_5175ef **)__filename;
      local_9c = 0;
      if (this_00 == (anon_unknown_dwarf_5175ef *)0x0) {
        pcVar3 = (char *)0x0;
      }
      else {
        pcVar3 = (char *)strlen((char *)this_00);
      }
      path.Length = 3;
      path.Data = pcVar3;
      eVar4 = _remove_all_r(this_00,path,(file_type)&local_9c,in_R8);
      return (int)CONCAT71(eVar4._1_7_,eVar4._M_value == 0);
    }
  }
  return (int)CONCAT71((uint7)(uint3)((uint)iVar1 >> 8),1);
}

Assistant:

virtual bool remove(const std::string& path) override {
    // Assume `path` is a regular file.
    if (llbuild::basic::sys::unlink(path.c_str()) == 0) {
      return true;
    }

#if defined(_WIN32)
    // Windows sets EACCES if the file is a directory
    if (errno != EACCES) {
      return false;
    }
#else
    // Error can't be that `path` is actually a directory (on Linux `EISDIR` will be returned since 2.1.132).
    if (errno != EPERM && errno != EISDIR) {
      return false;
    }
#endif

    // Check if `path` is a directory.
    llbuild::basic::sys::StatStruct statbuf;
    if (llbuild::basic::sys::lstat(path.c_str(), &statbuf) != 0) {
      return false;
    }

    if (S_ISDIR(statbuf.st_mode)) {
      if (llbuild::basic::sys::rmdir(path.c_str()) == 0) {
        return true;
      } else {
        return rm_tree(path.c_str());
      }
    }

    return false;
  }